

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclUpsize.c
# Opt level: O0

void Abc_SclUpsizePrint(SC_Man *p,int Iter,int win,int nPathPos,int nPathNodes,int nUpsizes,
                       int nTFOs,int fVerbose)

{
  abctime aVar1;
  undefined8 uVar2;
  int nUpsizes_local;
  int nPathNodes_local;
  int nPathPos_local;
  int win_local;
  int Iter_local;
  SC_Man *p_local;
  
  printf("%4d ",(ulong)(uint)Iter);
  printf("Win:%3d. ",(ulong)(uint)win);
  printf("PO:%6d. ",(ulong)(uint)nPathPos);
  printf("Path:%7d. ",(ulong)(uint)nPathNodes);
  printf("Gate:%5d. ",(ulong)(uint)nUpsizes);
  printf("TFO:%7d. ",(ulong)(uint)nTFOs);
  printf("A: ");
  printf("%.2f ",(double)p->SumArea);
  printf("(%+5.1f %%)  ",((double)(p->SumArea - p->SumArea0) * 100.0) / (double)p->SumArea0);
  printf("D: ");
  printf("%.2f ps ",(double)p->MaxDelay);
  printf("(%+5.1f %%)  ",((double)(p->MaxDelay - p->MaxDelay0) * 100.0) / (double)p->MaxDelay0);
  printf("B: ");
  printf("%.2f ps ",(double)p->BestDelay);
  printf("(%+5.1f %%)",((double)(p->BestDelay - p->MaxDelay0) * 100.0) / (double)p->MaxDelay0);
  aVar1 = Abc_Clock();
  printf("%8.2f sec    ",((double)(aVar1 - p->timeTotal) * 1.0) / 1000000.0);
  uVar2 = 0xd;
  if (fVerbose != 0) {
    uVar2 = 10;
  }
  printf("%c",uVar2);
  return;
}

Assistant:

void Abc_SclUpsizePrint( SC_Man * p, int Iter, int win, int nPathPos, int nPathNodes, int nUpsizes, int nTFOs, int fVerbose )
{
    printf( "%4d ",          Iter );
    printf( "Win:%3d. ",     win );
    printf( "PO:%6d. ",      nPathPos );
    printf( "Path:%7d. ",    nPathNodes );
    printf( "Gate:%5d. ",    nUpsizes );
    printf( "TFO:%7d. ",     nTFOs );
    printf( "A: " );
    printf( "%.2f ",         p->SumArea );
    printf( "(%+5.1f %%)  ", 100.0 * (p->SumArea - p->SumArea0)/ p->SumArea0 );
    printf( "D: " );
    printf( "%.2f ps ",      p->MaxDelay );
    printf( "(%+5.1f %%)  ", 100.0 * (p->MaxDelay - p->MaxDelay0)/ p->MaxDelay0 );
    printf( "B: " );
    printf( "%.2f ps ",      p->BestDelay );
    printf( "(%+5.1f %%)",   100.0 * (p->BestDelay - p->MaxDelay0)/ p->MaxDelay0 );
    printf( "%8.2f sec    ", 1.0*(Abc_Clock() - p->timeTotal)/(CLOCKS_PER_SEC) );
    printf( "%c", fVerbose ? '\n' : '\r' );
}